

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O3

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  int iVar1;
  Aig_Obj_t *pObj;
  int *piVar2;
  int iVar3;
  uint uVar4;
  Cnf_Dat_t *pCVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  void **ppvVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  Aig_Man_t *pAVar13;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                  ,0x1b5,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf != 0) {
    pCVar5 = p->pCnf1;
    if (pCVar5 == (Cnf_Dat_t *)0x0) {
      pAVar13 = p->pAig;
      iVar11 = pAVar13->nRegs;
      iVar1 = pAVar13->nObjs[3];
      pAVar13->nRegs = iVar1;
      pCVar5 = Cnf_DeriveWithMan(p->pCnfMan,pAVar13,iVar1);
      p->pCnf1 = pCVar5;
      pAVar13 = p->pAig;
      pAVar13->nRegs = iVar11;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar1 = pCVar5->nVars;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      iVar3 = 0x10;
      if (0xe < iVar1 - 1U) {
        iVar3 = iVar1;
      }
      pVVar6->nCap = iVar3;
      if (iVar3 == 0) {
        piVar7 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc((long)iVar3 << 2);
      }
      pVVar6->pArray = piVar7;
      pVVar6->nSize = iVar1;
      memset(piVar7,0xff,(long)iVar1 << 2);
      p->vVar2Reg = pVVar6;
      if (0 < iVar11) {
        iVar11 = 0;
        do {
          uVar4 = pAVar13->nTruePos + iVar11;
          if (((int)uVar4 < 0) || (pAVar13->vCos->nSize <= (int)uVar4)) goto LAB_0055112f;
          pObj = (Aig_Obj_t *)pAVar13->vCos->pArray[uVar4];
          pVVar6 = p->vVar2Reg;
          if (p->pPars->fMonoCnf == 0) {
            uVar4 = Pdr_ObjSatVar2(p,k,pObj,0,3);
          }
          else {
            uVar4 = p->pCnf1->pVarNums[pObj->Id];
          }
          if (((int)uVar4 < 0) || (pVVar6->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar6->pArray[uVar4] = iVar11;
          iVar11 = iVar11 + 1;
          pAVar13 = p->pAig;
        } while (iVar11 < pAVar13->nRegs);
        pCVar5 = p->pCnf1;
      }
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,pCVar5,1,fInit);
    goto LAB_0055110f;
  }
  if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
    pCVar5 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
    p->pCnf2 = pCVar5;
    pVVar6 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
    p->pvId2Vars = pVVar6;
    if ((p->vVar2Ids).nCap < 0x100) {
      ppvVar8 = (p->vVar2Ids).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x800);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x800);
      }
      (p->vVar2Ids).pArray = ppvVar8;
      (p->vVar2Ids).nCap = 0x100;
    }
  }
  iVar11 = (p->vVar2Ids).nSize;
  if (iVar11 <= k) {
    iVar1 = k + 1;
    iVar3 = (p->vVar2Ids).nCap;
    if (k < iVar3 * 2) {
      if (iVar3 <= k) {
        ppvVar8 = (p->vVar2Ids).pArray;
        if (ppvVar8 == (void **)0x0) {
          ppvVar8 = (void **)malloc((long)iVar3 << 4);
        }
        else {
          ppvVar8 = (void **)realloc(ppvVar8,(long)iVar3 << 4);
        }
        (p->vVar2Ids).pArray = ppvVar8;
        iVar11 = iVar3 * 2;
LAB_0055100f:
        (p->vVar2Ids).nCap = iVar11;
        iVar11 = (p->vVar2Ids).nSize;
      }
    }
    else if (iVar3 <= k) {
      ppvVar8 = (p->vVar2Ids).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,(long)iVar1 << 3);
      }
      (p->vVar2Ids).pArray = ppvVar8;
      iVar11 = iVar1;
      goto LAB_0055100f;
    }
    if (iVar11 <= k) {
      lVar10 = (long)iVar11;
      do {
        (p->vVar2Ids).pArray[lVar10] = (void *)0x0;
        lVar10 = lVar10 + 1;
      } while (iVar1 != lVar10);
    }
    (p->vVar2Ids).nSize = iVar1;
    iVar11 = iVar1;
  }
  if ((k < 0) || (iVar11 <= k)) {
LAB_0055112f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar8 = (p->vVar2Ids).pArray;
  pVVar6 = (Vec_Int_t *)ppvVar8[(uint)k];
  if (pVVar6 == (Vec_Int_t *)0x0) {
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    piVar7 = &pVVar6->nSize;
    pVVar6->nCap = 500;
    pVVar6->nSize = 0;
    piVar9 = (int *)malloc(2000);
    pVVar6->pArray = piVar9;
    ppvVar8[(uint)k] = pVVar6;
  }
  else {
    piVar7 = &pVVar6->nSize;
    iVar11 = pVVar6->nSize;
    if (0 < iVar11) {
      piVar9 = pVVar6->pArray;
      lVar10 = 0;
      do {
        lVar12 = (long)piVar9[lVar10];
        if (lVar12 != -1) {
          if (p->pvId2Vars[lVar12].nSize <= k) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar2 = p->pvId2Vars[lVar12].pArray;
          if (piVar2[(uint)k] < 1) {
            __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                          ,0x19c,
                          "sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)");
          }
          piVar2[(uint)k] = 0;
          iVar11 = *piVar7;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar11);
    }
  }
  *piVar7 = 0;
  Vec_IntPush(pVVar6,-1);
  sat_solver_setnvars(pSat,500);
LAB_0055110f:
  pSat->nRuntimeLimit = p->timeToStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}